

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseInputMessageContent_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  __type_conflict _Var2;
  element_type *peVar3;
  Ptr local_198;
  string local_188;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  shared_ptr<TgBot::InputMessageContent> local_140;
  string local_130;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Ptr local_e8;
  string local_d8;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  shared_ptr<TgBot::InputMessageContent> local_90;
  string local_80;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    peVar3 = std::
             __shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"InputTextMessageContent",&local_59);
    _Var2 = std::operator==(&peVar3->type,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (_Var2) {
      std::static_pointer_cast<TgBot::InputTextMessageContent,TgBot::InputMessageContent>(&local_90)
      ;
      parseInputTextMessageContent_abi_cxx11_(&local_80,this,(Ptr *)&local_90);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::shared_ptr<TgBot::InputTextMessageContent>::~shared_ptr
                ((shared_ptr<TgBot::InputTextMessageContent> *)&local_90);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"InputLocationMessageContent",&local_b1);
      _Var2 = std::operator==(&peVar3->type,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (_Var2) {
        std::static_pointer_cast<TgBot::InputLocationMessageContent,TgBot::InputMessageContent>
                  ((shared_ptr<TgBot::InputMessageContent> *)&local_e8);
        parseInputLocationMessageContent_abi_cxx11_(&local_d8,this,&local_e8);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::shared_ptr<TgBot::InputLocationMessageContent>::~shared_ptr(&local_e8);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_108,"InputVenueMessageContent",&local_109);
        _Var2 = std::operator==(&peVar3->type,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        if (_Var2) {
          std::static_pointer_cast<TgBot::InputVenueMessageContent,TgBot::InputMessageContent>
                    (&local_140);
          parseInputVenueMessageContent_abi_cxx11_(&local_130,this,(Ptr *)&local_140);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::shared_ptr<TgBot::InputVenueMessageContent>::~shared_ptr
                    ((shared_ptr<TgBot::InputVenueMessageContent> *)&local_140);
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_160,"InputContactMessageContent",&local_161)
          ;
          _Var2 = std::operator==(&peVar3->type,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          if (_Var2) {
            std::static_pointer_cast<TgBot::InputContactMessageContent,TgBot::InputMessageContent>
                      ((shared_ptr<TgBot::InputMessageContent> *)&local_198);
            parseInputContactMessageContent_abi_cxx11_(&local_188,this,&local_198);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::shared_ptr<TgBot::InputContactMessageContent>::~shared_ptr(&local_198);
          }
        }
      }
    }
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInputMessageContent(const InputMessageContent::Ptr& object) const {
    if (!object){
        return "";
    }

    string result;
    result += '{';

    if (object->type == std::string("InputTextMessageContent")) {
        result += parseInputTextMessageContent(static_pointer_cast<InputTextMessageContent>(object));
    }
    else if (object->type == std::string("InputLocationMessageContent")) {
        result += parseInputLocationMessageContent(static_pointer_cast<InputLocationMessageContent>(object));
    }
    else if (object->type == std::string("InputVenueMessageContent")) {
        result += parseInputVenueMessageContent(static_pointer_cast<InputVenueMessageContent>(object));
    }
    else if (object->type == std::string("InputContactMessageContent")) {
        result += parseInputContactMessageContent(static_pointer_cast<InputContactMessageContent>(object));
    }

    removeLastComma(result);
    result += '}';
    return result;
}